

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<double>::AddSub(TPZMatrix<double> *this,int64_t sRow,int64_t sCol,TPZFMatrix<double> *A)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double local_38;
  
  lVar4 = (this->super_TPZBaseMatrix).fRow - sRow;
  lVar2 = (A->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar1 = (A->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (lVar2 < lVar4) {
    lVar4 = lVar2;
  }
  lVar2 = (this->super_TPZBaseMatrix).fCol - sCol;
  if (lVar1 < lVar2) {
    lVar2 = lVar1;
  }
  if (0 < lVar4) {
    lVar1 = 0;
    do {
      if (0 < lVar2) {
        lVar3 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (this,sRow,sCol + lVar3);
          (*(A->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
          )(A,lVar1,lVar3);
          local_38 = extraout_XMM0_Qa_00 + extraout_XMM0_Qa;
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,sRow,sCol + lVar3,&local_38);
          lVar3 = lVar3 + 1;
        } while (lVar2 != lVar3);
      }
      lVar1 = lVar1 + 1;
      sRow = sRow + 1;
    } while (lVar1 != lVar4);
  }
  return 1;
}

Assistant:

const TPZFMatrix<TVar> TPZMatrix<TVar>::Storage() const
{
  const auto size = Size();
  const auto elem = Elem();
	TPZFMatrix<TVar> ref(size,1,const_cast<TVar*>(elem),size);
	return ref;
}